

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void death_knowledge(player *p)

{
  uint32_t *puVar1;
  byte bVar2;
  object *poVar3;
  object *poVar4;
  store_conflict *psVar5;
  object **ppoVar6;
  time_t death_time;
  
  psVar5 = stores;
  bVar2 = f_info[0xe].shopnum;
  death_time = 0;
  if (p->total_winner != 0) {
    p->depth = 0;
    my_strcpy(p->died_from,"Ripe Old Age",0x50);
    p->exp = p->max_exp;
    p->lev = p->max_lev;
    p->au = p->au + 10000000;
  }
  player_learn_all_runes(p);
  ppoVar6 = &p->gear;
  while (poVar3 = *ppoVar6, poVar3 != (object *)0x0) {
    object_flavor_aware(p,poVar3);
    poVar4 = poVar3->known;
    poVar4->effect = poVar3->effect;
    poVar4->activation = poVar3->activation;
    ppoVar6 = &poVar3->next;
  }
  ppoVar6 = &psVar5[(ulong)bVar2 - 1].stock;
  while (poVar3 = *ppoVar6, poVar3 != (object *)0x0) {
    object_flavor_aware(p,poVar3);
    poVar4 = poVar3->known;
    poVar4->effect = poVar3->effect;
    poVar4->activation = poVar3->activation;
    ppoVar6 = &poVar3->next;
  }
  history_unmask_unknown(p);
  time(&death_time);
  enter_score(p,&death_time);
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 1;
  handle_stuff(p);
  return;
}

Assistant:

void death_knowledge(struct player *p)
{
	struct store *home = &stores[f_info[FEAT_HOME].shopnum - 1];
	struct object *obj;
	time_t death_time = (time_t)0;

	/* Retire in the town in a good state */
	if (p->total_winner) {
		p->depth = 0;
		my_strcpy(p->died_from, "Ripe Old Age", sizeof(p->died_from));
		p->exp = p->max_exp;
		p->lev = p->max_lev;
		p->au += 10000000L;
	}

	player_learn_all_runes(p);
	for (obj = p->gear; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	for (obj = home->stock; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	history_unmask_unknown(p);

	/* Get time of death */
	(void)time(&death_time);
	enter_score(p, &death_time);

	/* Hack -- Recalculate bonuses */
	p->upkeep->update |= (PU_BONUS);
	handle_stuff(p);
}